

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBackwardCompatibility.cpp
# Opt level: O3

void anon_unknown.dwarf_444b6::diffImageFiles(char *fn1,char *fn2)

{
  int iVar1;
  int iVar2;
  BaseExc *pBVar3;
  string e;
  stringstream _iex_throw_s;
  ifstream i2;
  ifstream i1;
  allocator<char> local_6c2;
  allocator<char> local_6c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  undefined1 local_5c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0 [23];
  long local_438 [2];
  char local_428 [16];
  byte abStack_418 [488];
  long local_230 [2];
  char local_220 [16];
  byte abStack_210 [488];
  
  std::ifstream::ifstream(local_230);
  std::ifstream::ifstream(local_438);
  std::filebuf::open(local_220,(_Ios_Openmode)fn1);
  std::filebuf::open(local_428,(_Ios_Openmode)fn2);
  if (*(int *)(abStack_210 + *(long *)(local_230[0] + -0x18)) != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_5c0);
    local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"cannot open ","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_680,fn1,(allocator<char> *)&local_660);
    std::operator+(&local_6a0,&local_6c0,&local_680);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_5c0 + 0x10),local_6a0._M_dataplus._M_p,local_6a0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
      operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_680._M_dataplus._M_p != &local_680.field_2) {
      operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
      operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
    }
    pBVar3 = (BaseExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::BaseExc::BaseExc(pBVar3,(stringstream *)local_5c0);
    __cxa_throw(pBVar3,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
  }
  if (*(int *)(abStack_418 + *(long *)(local_438[0] + -0x18)) != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_5c0);
    local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"cannot open ","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_680,fn2,(allocator<char> *)&local_660);
    std::operator+(&local_6a0,&local_6c0,&local_680);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_5c0 + 0x10),local_6a0._M_dataplus._M_p,local_6a0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
      operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_680._M_dataplus._M_p != &local_680.field_2) {
      operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
      operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
    }
    pBVar3 = (BaseExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::BaseExc::BaseExc(pBVar3,(stringstream *)local_5c0);
    __cxa_throw(pBVar3,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
  }
  while (((abStack_210[*(long *)(local_230[0] + -0x18)] & 2) == 0 &&
         ((abStack_418[*(long *)(local_438[0] + -0x18)] & 2) == 0))) {
    iVar1 = std::istream::get();
    iVar2 = std::istream::get();
    if (iVar1 != iVar2) {
      local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_660,"v1.7 and current differences between \'","");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,fn1,&local_6c1);
      std::operator+(&local_680,&local_660,&local_5e0);
      local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"\' & \'","");
      std::operator+(&local_6c0,&local_680,&local_620);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,fn2,&local_6c2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
                     &local_6c0,&local_600);
      local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"\'","");
      std::operator+(&local_6a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
                     &local_640);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_640._M_dataplus._M_p != &local_640.field_2) {
        operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
        operator_delete((void *)local_5c0._0_8_,local_5b0[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_600._M_dataplus._M_p != &local_600.field_2) {
        operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
        operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_620._M_dataplus._M_p != &local_620.field_2) {
        operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_680._M_dataplus._M_p != &local_680.field_2) {
        operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
        operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_660._M_dataplus._M_p != &local_660.field_2) {
        operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
      }
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)local_5c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_5c0 + 0x10),local_6a0._M_dataplus._M_p,local_6a0._M_string_length
                );
      pBVar3 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::BaseExc::BaseExc(pBVar3,(stringstream *)local_5c0);
      __cxa_throw(pBVar3,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
    }
  }
  std::ifstream::~ifstream(local_438);
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

void
diffImageFiles (const char* fn1, const char* fn2)
{
    ifstream i1, i2;
    testutil::OpenStreamWithUTF8Name (i1, fn1, ios::in | ios::binary);
    testutil::OpenStreamWithUTF8Name (i2, fn2, ios::in | ios::binary);

    if (!i1.good ())
    {
        THROW (IEX_NAMESPACE::BaseExc, string ("cannot open ") + string (fn1));
    }
    if (!i2.good ())
    {
        THROW (IEX_NAMESPACE::BaseExc, string ("cannot open ") + string (fn2));
    }

    while (!i1.eof () && !i2.eof ())
    {
        if (i1.get () != i2.get ())
        {
            string e = string ("v1.7 and current differences between '") +
                       string (fn1) + string ("' & '") + string (fn2) +
                       string ("'");
            THROW (IEX_NAMESPACE::BaseExc, e);
        }
    }
}